

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O0

void cfl_luma_subsampling_420_hbd_ssse3
               (uint16_t *input,int input_stride,uint16_t *pred_buf_q3,int width,int height)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 *puVar16;
  int in_ECX;
  undefined8 *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  int in_R8D;
  undefined1 auVar17 [16];
  __m128i top_1;
  __m128i sum_1;
  __m128i bot_4;
  __m128i top_4;
  __m128i sum;
  __m128i bot;
  __m128i top;
  int luma_stride;
  uint16_t *end;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_308;
  undefined8 *local_2c0;
  undefined8 *local_2b0;
  short local_298;
  short sStack_296;
  short sStack_294;
  short sStack_292;
  short sStack_290;
  short sStack_28e;
  short sStack_28c;
  short sStack_28a;
  short local_288;
  short sStack_286;
  short sStack_284;
  short sStack_282;
  short sStack_280;
  short sStack_27e;
  short sStack_27c;
  short sStack_27a;
  short local_278;
  short sStack_276;
  short sStack_274;
  short sStack_272;
  short sStack_270;
  short sStack_26e;
  short sStack_26c;
  short sStack_26a;
  short local_268;
  short sStack_266;
  short sStack_264;
  short sStack_262;
  short sStack_260;
  short sStack_25e;
  short sStack_25c;
  short sStack_25a;
  short local_258;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  short sStack_250;
  short sStack_24e;
  short sStack_24c;
  short sStack_24a;
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  short local_228;
  short sStack_226;
  short sStack_224;
  short sStack_222;
  short sStack_220;
  short sStack_21e;
  short sStack_21c;
  short sStack_21a;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short local_1e8;
  short sStack_1e6;
  short sStack_1e4;
  short sStack_1e2;
  short sStack_1e0;
  short sStack_1de;
  short sStack_1dc;
  short sStack_1da;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  short local_1b8;
  short sStack_1b6;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  __m128i next_sum;
  __m128i sum_3;
  __m128i sum_2;
  __m128i bot_3;
  __m128i top_3;
  __m128i bot_2;
  __m128i top_2;
  __m128i bot_1;
  
  local_2c0 = in_RDX;
  local_2b0 = in_RDI;
  do {
    if (in_ECX == 4) {
      uVar1 = *local_2b0;
      uVar2 = *(undefined8 *)((long)local_2b0 + (long)in_ESI * 2);
      local_198 = (short)uVar1;
      sStack_196 = (short)((ulong)uVar1 >> 0x10);
      sStack_194 = (short)((ulong)uVar1 >> 0x20);
      sStack_192 = (short)((ulong)uVar1 >> 0x30);
      local_1a8 = (short)uVar2;
      sStack_1a6 = (short)((ulong)uVar2 >> 0x10);
      sStack_1a4 = (short)((ulong)uVar2 >> 0x20);
      sStack_1a2 = (short)((ulong)uVar2 >> 0x30);
      local_308 = CONCAT26(sStack_192 + sStack_1a2,
                           CONCAT24(sStack_194 + sStack_1a4,
                                    CONCAT22(sStack_196 + sStack_1a6,local_198 + local_1a8)));
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_308;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_308;
      auVar17 = phaddw(auVar15,auVar14);
      local_1b8 = auVar17._0_2_;
      sStack_1b6 = auVar17._2_2_;
      *(uint *)local_2c0 = CONCAT22(sStack_1b6 * 2,local_1b8 * 2);
    }
    else {
      uVar1 = *local_2b0;
      uVar2 = local_2b0[1];
      puVar16 = (undefined8 *)((long)local_2b0 + (long)in_ESI * 2);
      uVar3 = *puVar16;
      uVar4 = puVar16[1];
      local_1d8 = (short)uVar1;
      sStack_1d6 = (short)((ulong)uVar1 >> 0x10);
      sStack_1d4 = (short)((ulong)uVar1 >> 0x20);
      sStack_1d2 = (short)((ulong)uVar1 >> 0x30);
      sStack_1d0 = (short)uVar2;
      sStack_1ce = (short)((ulong)uVar2 >> 0x10);
      sStack_1cc = (short)((ulong)uVar2 >> 0x20);
      sStack_1ca = (short)((ulong)uVar2 >> 0x30);
      local_1e8 = (short)uVar3;
      sStack_1e6 = (short)((ulong)uVar3 >> 0x10);
      sStack_1e4 = (short)((ulong)uVar3 >> 0x20);
      sStack_1e2 = (short)((ulong)uVar3 >> 0x30);
      sStack_1e0 = (short)uVar4;
      sStack_1de = (short)((ulong)uVar4 >> 0x10);
      sStack_1dc = (short)((ulong)uVar4 >> 0x20);
      sStack_1da = (short)((ulong)uVar4 >> 0x30);
      local_338._0_4_ = CONCAT22(sStack_1d6 + sStack_1e6,local_1d8 + local_1e8);
      local_338._0_6_ = CONCAT24(sStack_1d4 + sStack_1e4,(undefined4)local_338);
      local_338 = CONCAT26(sStack_1d2 + sStack_1e2,(undefined6)local_338);
      uStack_330._0_2_ = sStack_1d0 + sStack_1e0;
      uStack_330._2_2_ = sStack_1ce + sStack_1de;
      uStack_330._4_2_ = sStack_1cc + sStack_1dc;
      uStack_330._6_2_ = sStack_1ca + sStack_1da;
      if (in_ECX == 8) {
        auVar13._8_8_ = uStack_330;
        auVar13._0_8_ = local_338;
        auVar12._8_8_ = uStack_330;
        auVar12._0_8_ = local_338;
        auVar17 = phaddw(auVar13,auVar12);
        local_1f8 = auVar17._0_2_;
        sStack_1f6 = auVar17._2_2_;
        sStack_1f4 = auVar17._4_2_;
        sStack_1f2 = auVar17._6_2_;
        *local_2c0 = CONCAT26(sStack_1f2 * 2,
                              CONCAT24(sStack_1f4 * 2,CONCAT22(sStack_1f6 * 2,local_1f8 * 2)));
      }
      else {
        uVar1 = local_2b0[2];
        uVar2 = local_2b0[3];
        uVar3 = *(undefined8 *)((long)local_2b0 + (long)in_ESI * 2 + 0x10);
        uVar4 = *(undefined8 *)((long)local_2b0 + (long)in_ESI * 2 + 0x18);
        local_218 = (short)uVar1;
        sStack_216 = (short)((ulong)uVar1 >> 0x10);
        sStack_214 = (short)((ulong)uVar1 >> 0x20);
        sStack_212 = (short)((ulong)uVar1 >> 0x30);
        sStack_210 = (short)uVar2;
        sStack_20e = (short)((ulong)uVar2 >> 0x10);
        sStack_20c = (short)((ulong)uVar2 >> 0x20);
        sStack_20a = (short)((ulong)uVar2 >> 0x30);
        local_228 = (short)uVar3;
        sStack_226 = (short)((ulong)uVar3 >> 0x10);
        sStack_224 = (short)((ulong)uVar3 >> 0x20);
        sStack_222 = (short)((ulong)uVar3 >> 0x30);
        sStack_220 = (short)uVar4;
        sStack_21e = (short)((ulong)uVar4 >> 0x10);
        sStack_21c = (short)((ulong)uVar4 >> 0x20);
        sStack_21a = (short)((ulong)uVar4 >> 0x30);
        auVar11._8_8_ = uStack_330;
        auVar11._0_8_ = local_338;
        auVar17._2_2_ = sStack_216 + sStack_226;
        auVar17._0_2_ = local_218 + local_228;
        auVar17._4_2_ = sStack_214 + sStack_224;
        auVar17._6_2_ = sStack_212 + sStack_222;
        auVar17._8_2_ = sStack_210 + sStack_220;
        auVar17._10_2_ = sStack_20e + sStack_21e;
        auVar17._12_2_ = sStack_20c + sStack_21c;
        auVar17._14_2_ = sStack_20a + sStack_21a;
        auVar17 = phaddw(auVar11,auVar17);
        local_238 = auVar17._0_2_;
        sStack_236 = auVar17._2_2_;
        sStack_234 = auVar17._4_2_;
        sStack_232 = auVar17._6_2_;
        sStack_230 = auVar17._8_2_;
        sStack_22e = auVar17._10_2_;
        sStack_22c = auVar17._12_2_;
        sStack_22a = auVar17._14_2_;
        *local_2c0 = CONCAT26(sStack_232 * 2,
                              CONCAT24(sStack_234 * 2,CONCAT22(sStack_236 * 2,local_238 * 2)));
        local_2c0[1] = CONCAT26(sStack_22a * 2,
                                CONCAT24(sStack_22c * 2,CONCAT22(sStack_22e * 2,sStack_230 * 2)));
        if (in_ECX == 0x20) {
          uVar1 = local_2b0[4];
          uVar2 = local_2b0[5];
          uVar3 = *(undefined8 *)((long)local_2b0 + (long)in_ESI * 2 + 0x20);
          uVar4 = *(undefined8 *)((long)local_2b0 + (long)in_ESI * 2 + 0x28);
          uVar5 = local_2b0[6];
          uVar6 = local_2b0[7];
          uVar7 = *(undefined8 *)((long)local_2b0 + (long)in_ESI * 2 + 0x30);
          uVar8 = *(undefined8 *)((long)local_2b0 + (long)in_ESI * 2 + 0x38);
          local_258 = (short)uVar1;
          sStack_256 = (short)((ulong)uVar1 >> 0x10);
          sStack_254 = (short)((ulong)uVar1 >> 0x20);
          sStack_252 = (short)((ulong)uVar1 >> 0x30);
          sStack_250 = (short)uVar2;
          sStack_24e = (short)((ulong)uVar2 >> 0x10);
          sStack_24c = (short)((ulong)uVar2 >> 0x20);
          sStack_24a = (short)((ulong)uVar2 >> 0x30);
          local_268 = (short)uVar3;
          sStack_266 = (short)((ulong)uVar3 >> 0x10);
          sStack_264 = (short)((ulong)uVar3 >> 0x20);
          sStack_262 = (short)((ulong)uVar3 >> 0x30);
          sStack_260 = (short)uVar4;
          sStack_25e = (short)((ulong)uVar4 >> 0x10);
          sStack_25c = (short)((ulong)uVar4 >> 0x20);
          sStack_25a = (short)((ulong)uVar4 >> 0x30);
          local_278 = (short)uVar5;
          sStack_276 = (short)((ulong)uVar5 >> 0x10);
          sStack_274 = (short)((ulong)uVar5 >> 0x20);
          sStack_272 = (short)((ulong)uVar5 >> 0x30);
          sStack_270 = (short)uVar6;
          sStack_26e = (short)((ulong)uVar6 >> 0x10);
          sStack_26c = (short)((ulong)uVar6 >> 0x20);
          sStack_26a = (short)((ulong)uVar6 >> 0x30);
          local_288 = (short)uVar7;
          sStack_286 = (short)((ulong)uVar7 >> 0x10);
          sStack_284 = (short)((ulong)uVar7 >> 0x20);
          sStack_282 = (short)((ulong)uVar7 >> 0x30);
          sStack_280 = (short)uVar8;
          sStack_27e = (short)((ulong)uVar8 >> 0x10);
          sStack_27c = (short)((ulong)uVar8 >> 0x20);
          sStack_27a = (short)((ulong)uVar8 >> 0x30);
          auVar10._2_2_ = sStack_256 + sStack_266;
          auVar10._0_2_ = local_258 + local_268;
          auVar10._4_2_ = sStack_254 + sStack_264;
          auVar10._6_2_ = sStack_252 + sStack_262;
          auVar10._10_2_ = sStack_24e + sStack_25e;
          auVar10._8_2_ = sStack_250 + sStack_260;
          auVar10._12_2_ = sStack_24c + sStack_25c;
          auVar10._14_2_ = sStack_24a + sStack_25a;
          auVar9._2_2_ = sStack_276 + sStack_286;
          auVar9._0_2_ = local_278 + local_288;
          auVar9._4_2_ = sStack_274 + sStack_284;
          auVar9._6_2_ = sStack_272 + sStack_282;
          auVar9._10_2_ = sStack_26e + sStack_27e;
          auVar9._8_2_ = sStack_270 + sStack_280;
          auVar9._12_2_ = sStack_26c + sStack_27c;
          auVar9._14_2_ = sStack_26a + sStack_27a;
          auVar17 = phaddw(auVar10,auVar9);
          local_298 = auVar17._0_2_;
          sStack_296 = auVar17._2_2_;
          sStack_294 = auVar17._4_2_;
          sStack_292 = auVar17._6_2_;
          sStack_290 = auVar17._8_2_;
          sStack_28e = auVar17._10_2_;
          sStack_28c = auVar17._12_2_;
          sStack_28a = auVar17._14_2_;
          local_2c0[2] = CONCAT26(sStack_292 * 2,
                                  CONCAT24(sStack_294 * 2,CONCAT22(sStack_296 * 2,local_298 * 2)));
          local_2c0[3] = CONCAT26(sStack_28a * 2,
                                  CONCAT24(sStack_28c * 2,CONCAT22(sStack_28e * 2,sStack_290 * 2)));
        }
      }
    }
    local_2b0 = (undefined8 *)((long)local_2b0 + (long)(in_ESI << 1) * 2);
    local_2c0 = local_2c0 + 8;
  } while (local_2c0 < (undefined8 *)((long)in_RDX + (long)((in_R8D >> 1) << 5) * 2));
  return;
}

Assistant:

static inline void cfl_luma_subsampling_420_hbd_ssse3(const uint16_t *input,
                                                      int input_stride,
                                                      uint16_t *pred_buf_q3,
                                                      int width, int height) {
  const uint16_t *end = pred_buf_q3 + (height >> 1) * CFL_BUF_LINE;
  const int luma_stride = input_stride << 1;
  do {
    if (width == 4) {
      const __m128i top = _mm_loadl_epi64((__m128i *)input);
      const __m128i bot = _mm_loadl_epi64((__m128i *)(input + input_stride));
      __m128i sum = _mm_add_epi16(top, bot);
      sum = _mm_hadd_epi16(sum, sum);
      *((int *)pred_buf_q3) = _mm_cvtsi128_si32(_mm_add_epi16(sum, sum));
    } else {
      const __m128i top = _mm_loadu_si128((__m128i *)input);
      const __m128i bot = _mm_loadu_si128((__m128i *)(input + input_stride));
      __m128i sum = _mm_add_epi16(top, bot);
      if (width == 8) {
        sum = _mm_hadd_epi16(sum, sum);
        _mm_storel_epi64((__m128i *)pred_buf_q3, _mm_add_epi16(sum, sum));
      } else {
        const __m128i top_1 = _mm_loadu_si128(((__m128i *)input) + 1);
        const __m128i bot_1 =
            _mm_loadu_si128(((__m128i *)(input + input_stride)) + 1);
        sum = _mm_hadd_epi16(sum, _mm_add_epi16(top_1, bot_1));
        _mm_storeu_si128((__m128i *)pred_buf_q3, _mm_add_epi16(sum, sum));
        if (width == 32) {
          const __m128i top_2 = _mm_loadu_si128(((__m128i *)input) + 2);
          const __m128i bot_2 =
              _mm_loadu_si128(((__m128i *)(input + input_stride)) + 2);
          const __m128i top_3 = _mm_loadu_si128(((__m128i *)input) + 3);
          const __m128i bot_3 =
              _mm_loadu_si128(((__m128i *)(input + input_stride)) + 3);
          const __m128i sum_2 = _mm_add_epi16(top_2, bot_2);
          const __m128i sum_3 = _mm_add_epi16(top_3, bot_3);
          __m128i next_sum = _mm_hadd_epi16(sum_2, sum_3);
          _mm_storeu_si128(((__m128i *)pred_buf_q3) + 1,
                           _mm_add_epi16(next_sum, next_sum));
        }
      }
    }
    input += luma_stride;
  } while ((pred_buf_q3 += CFL_BUF_LINE) < end);
}